

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall ON_SubDLevel::UpdateEdgeTags(ON_SubDLevel *this,bool bUnsetEdgeTagsOnly)

{
  double dVar1;
  double dVar2;
  ON_SubDEdgeTag OVar3;
  ON_SubDEdge *pOVar4;
  bool bVar5;
  uint uVar6;
  uint tagged_end_index;
  bool bBothVertexTagsAreSet;
  double edge_sector_coefficient0 [2];
  ON_SubDEdge *pOStack_28;
  ON_SubDEdgeTag edge_tag0;
  ON_SubDEdge *edge;
  ON_SubDEdge *next_edge;
  uint edge_change_count;
  bool bUnsetEdgeTagsOnly_local;
  ON_SubDLevel *this_local;
  
  next_edge._0_4_ = 0;
  pOVar4 = this->m_edge[0];
  while (pOStack_28 = pOVar4, pOStack_28 != (ON_SubDEdge *)0x0) {
    pOVar4 = pOStack_28->m_next_edge;
    if ((pOStack_28->m_face_count != 2) && (bVar5 = ON_SubDEdge::IsSmooth(pOStack_28), bVar5)) {
      pOStack_28->m_edge_tag = Unset;
    }
    OVar3 = pOStack_28->m_edge_tag;
    if ((!bUnsetEdgeTagsOnly) || (OVar3 == Unset)) {
      if ((pOStack_28->m_vertex[0] == (ON_SubDVertex *)0x0) ||
         (pOStack_28->m_vertex[1] == (ON_SubDVertex *)0x0)) {
        ON_SubDIncrementErrorCount();
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                   ,0x4cf9,"","nullptr edge->m_vertex[] values");
      }
      else {
        dVar1 = pOStack_28->m_sector_coefficient[0];
        dVar2 = pOStack_28->m_sector_coefficient[1];
        if (pOStack_28->m_face_count == 2) {
          pOStack_28->m_sector_coefficient[0] = -8883.0;
          pOStack_28->m_sector_coefficient[1] = -8883.0;
          bVar5 = false;
          if (pOStack_28->m_vertex[0]->m_vertex_tag != Unset) {
            bVar5 = pOStack_28->m_vertex[1]->m_vertex_tag != Unset;
          }
          uVar6 = ON_SubDEdge::TaggedEndIndex(pOStack_28);
          if ((uVar6 == 0) || (uVar6 == 1)) {
            pOStack_28->m_sector_coefficient[uVar6] = 0.0;
          }
          switch(OVar3) {
          case Unset:
            if (uVar6 == 2) {
              pOStack_28->m_edge_tag = SmoothX;
            }
            else if ((bVar5) && (pOStack_28->m_edge_tag = Smooth, uVar6 == 3)) {
              pOStack_28->m_sector_coefficient[0] = 0.0;
              pOStack_28->m_sector_coefficient[1] = 0.0;
            }
            break;
          case Smooth:
            if (uVar6 == 2) {
              pOStack_28->m_edge_tag = SmoothX;
            }
            else if ((uVar6 == 3) && (bVar5)) {
              pOStack_28->m_sector_coefficient[0] = 0.0;
              pOStack_28->m_sector_coefficient[1] = 0.0;
            }
            break;
          case Crease:
            pOStack_28->m_sector_coefficient[0] = 0.0;
            pOStack_28->m_sector_coefficient[1] = 0.0;
            break;
          default:
            break;
          case SmoothX:
            if ((uVar6 != 2) && (bVar5)) {
              pOStack_28->m_edge_tag = Smooth;
            }
          }
        }
        else {
          pOStack_28->m_edge_tag = Crease;
          pOStack_28->m_sector_coefficient[0] = 0.0;
          pOStack_28->m_sector_coefficient[1] = 0.0;
        }
        if ((((OVar3 != pOStack_28->m_edge_tag) || (dVar1 != pOStack_28->m_sector_coefficient[0]))
            || (NAN(dVar1) || NAN(pOStack_28->m_sector_coefficient[0]))) ||
           ((dVar2 != pOStack_28->m_sector_coefficient[1] ||
            (NAN(dVar2) || NAN(pOStack_28->m_sector_coefficient[1]))))) {
          next_edge._0_4_ = (uint)next_edge + 1;
        }
      }
    }
  }
  return (uint)next_edge;
}

Assistant:

unsigned int ON_SubDLevel::UpdateEdgeTags(
  bool bUnsetEdgeTagsOnly
  )
{
  // Update edge flags and sector coefficients.
  unsigned int edge_change_count = 0;
  ON_SubDEdge* next_edge = m_edge[0];
  for (ON_SubDEdge* edge = next_edge; nullptr != edge; edge = next_edge)
  {
    next_edge = const_cast<ON_SubDEdge*>(edge->m_next_edge);

    if (2 != edge->m_face_count && edge->IsSmooth())
    {
      // Dale Lear - Added April 5, 2021 - don't tolerate obvious errors / oversights.
      edge->m_edge_tag = ON_SubDEdgeTag::Unset;
    }

    const ON_SubDEdgeTag edge_tag0 = edge->m_edge_tag;
    if (bUnsetEdgeTagsOnly && ON_SubDEdgeTag::Unset != edge_tag0 )
    {
      continue;
    }

    if (nullptr == edge->m_vertex[0] || nullptr == edge->m_vertex[1])
    {
      ON_SUBD_ERROR("nullptr edge->m_vertex[] values");
      continue;
    }

    const double edge_sector_coefficient0[2] = { edge->m_sector_coefficient[0], edge->m_sector_coefficient[1] };

    if (2 != edge->m_face_count)
    {
      edge->m_edge_tag = ON_SubDEdgeTag::Crease;
      edge->m_sector_coefficient[0] = ON_SubDSectorType::IgnoredSectorCoefficient;
      edge->m_sector_coefficient[1] = ON_SubDSectorType::IgnoredSectorCoefficient;
    }
    else
    {
      edge->m_sector_coefficient[0] = ON_SubDSectorType::UnsetSectorCoefficient;
      edge->m_sector_coefficient[1] = ON_SubDSectorType::UnsetSectorCoefficient;
      const bool bBothVertexTagsAreSet
        =  ON_SubDVertexTag::Unset != edge->m_vertex[0]->m_vertex_tag
        && ON_SubDVertexTag::Unset != edge->m_vertex[1]->m_vertex_tag
        ;
      const unsigned int tagged_end_index = edge->TaggedEndIndex();
      if (0 == tagged_end_index || 1 == tagged_end_index)
        edge->m_sector_coefficient[tagged_end_index] = ON_SubDSectorType::IgnoredSectorCoefficient;

      switch (edge_tag0)
      {
      case ON_SubDEdgeTag::Unset:
        if (2 == tagged_end_index)
        {
          edge->m_edge_tag = ON_SubDEdgeTag::SmoothX;
        }
        else if ( bBothVertexTagsAreSet )
        {
          edge->m_edge_tag = ON_SubDEdgeTag::Smooth;
          if (3 == tagged_end_index)
          {
            edge->m_sector_coefficient[0] = ON_SubDSectorType::IgnoredSectorCoefficient;
            edge->m_sector_coefficient[1] = ON_SubDSectorType::IgnoredSectorCoefficient;
          }
        }
        break;

      case ON_SubDEdgeTag::Smooth:
        if (2 == tagged_end_index)
        {
          edge->m_edge_tag = ON_SubDEdgeTag::SmoothX;
        }
        else if (3 == tagged_end_index && bBothVertexTagsAreSet)
        {
          edge->m_sector_coefficient[0] = ON_SubDSectorType::IgnoredSectorCoefficient;
          edge->m_sector_coefficient[1] = ON_SubDSectorType::IgnoredSectorCoefficient;
        }
        break;

      case ON_SubDEdgeTag::Crease:
        edge->m_sector_coefficient[0] = ON_SubDSectorType::IgnoredSectorCoefficient;
        edge->m_sector_coefficient[1] = ON_SubDSectorType::IgnoredSectorCoefficient;
        break;

      case ON_SubDEdgeTag::SmoothX:
        if ( 2 != tagged_end_index && bBothVertexTagsAreSet)
          edge->m_edge_tag = ON_SubDEdgeTag::Smooth;
        break;

      default:
        break;
      }
    }

    if (!(edge_tag0 == edge->m_edge_tag
      && edge_sector_coefficient0[0] == edge->m_sector_coefficient[0]
      && edge_sector_coefficient0[1] == edge->m_sector_coefficient[1]))
      edge_change_count++;
  }

  return edge_change_count;
}